

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O1

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::AddAgents::operator()
          (AddAgents *this,iterator_t *first,iterator_t *last)

{
  size_t *psVar1;
  pointer pbVar2;
  DecPOMDPDiscrete *this_00;
  pointer pcVar3;
  ParserDPOMDPFormat_Spirit *pPVar4;
  pointer pbVar5;
  string local_50;
  
  MultiAgentDecisionProcess::SetNrAgents
            ((MultiAgentDecisionProcess *)this->_m_po->_m_decPOMDPDiscrete,0);
  pbVar5 = (this->_m_po->_m_curIdentList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->_m_po->_m_curIdentList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar2) {
    do {
      this_00 = this->_m_po->_m_decPOMDPDiscrete;
      pcVar3 = (pbVar5->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + pbVar5->_M_string_length);
      MultiAgentDecisionProcess::AddAgent((MultiAgentDecisionProcess *)this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pbVar5 = pbVar5 + 1;
      psVar1 = &this->_m_po->_m_nrA;
      *psVar1 = *psVar1 + 1;
    } while (pbVar5 != pbVar2);
  }
  pPVar4 = this->_m_po;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pPVar4->_m_curIdentList,
                    (pPVar4->_m_curIdentList).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pPVar4->_m_identListModified = false;
  return;
}

Assistant:

void operator()(iterator_t first, iterator_t last) const
            {   
                _m_po->GetDecPOMDPDiscrete()->SetNrAgents(0);
                std::vector<std::string>::iterator it = _m_po->_m_curIdentList.begin();
                std::vector<std::string>::iterator l = _m_po->_m_curIdentList.end();
                while(it != l)
                {
                    _m_po->GetDecPOMDPDiscrete()->AddAgent(*it);
                    it++;
                    _m_po->_m_nrA++;
                }
                _m_po->ClearCurIdentList();
            }